

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_name(PyObject *self,PyObject *args)

{
  int iVar1;
  long lVar2;
  PyObject *pPVar3;
  long lVar4;
  PyObject *obj;
  undefined *local_10;
  
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:name",&local_10);
  if (iVar1 == 0) {
    return (PyObject *)0x0;
  }
  if (local_10 == &_Py_NoneStruct) {
    lVar2 = 0;
  }
  else {
    lVar2 = *(long *)(local_10 + 0x10);
  }
  iVar1 = *(int *)(lVar2 + 8);
  lVar4 = 0x88;
  if (iVar1 < 0xd) {
    if ((iVar1 != 2) && (iVar1 == 9)) goto LAB_0013d340;
  }
  else {
    if (iVar1 == 0xd) goto LAB_0013d340;
    if (iVar1 == 0x12) {
      lVar4 = 0x18;
      goto LAB_0013d340;
    }
  }
  lVar4 = 0x10;
LAB_0013d340:
  pPVar3 = libxml_constxmlCharPtrWrap(*(xmlChar **)(lVar2 + lVar4));
  return pPVar3;
}

Assistant:

static PyObject *
libxml_name(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    const xmlChar *res;

    if (!PyArg_ParseTuple(args, (char *) "O:name", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

    switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:{
                xmlDocPtr doc = (xmlDocPtr) cur;

                res = doc->URL;
                break;
            }
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = attr->name;
                break;
            }
        case XML_NAMESPACE_DECL:{
                xmlNsPtr ns = (xmlNsPtr) cur;

                res = ns->prefix;
                break;
            }
        default:
            res = cur->name;
            break;
    }
    resultobj = libxml_constxmlCharPtrWrap(res);

    return resultobj;
}